

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O2

void __thiscall
gss::innards::Proof::incompatible_by_degrees
          (Proof *this,int g,NamedVertex *p,vector<int,_std::allocator<int>_> *n_p,NamedVertex *t,
          vector<int,_std::allocator<int>_> *n_t)

{
  long *plVar1;
  int *piVar2;
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  uVar3;
  ostream *poVar4;
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var5;
  size_type sVar6;
  mapped_type *pmVar7;
  vector<int,_std::allocator<int>_> *__range2_1;
  map<std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this_00;
  bool bVar8;
  vector<int,_std::allocator<int>_> *__range2;
  int *n;
  int *piVar9;
  int *n_3;
  long lVar10;
  key_type local_58;
  vector<int,_std::allocator<int>_> *local_38;
  
  poVar4 = std::operator<<((ostream *)
                           (((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->proof_stream)._M_t,"* cannot map ");
  poVar4 = std::operator<<(poVar4,(string *)&p->second);
  poVar4 = std::operator<<(poVar4," to ");
  poVar4 = std::operator<<(poVar4,(string *)&t->second);
  poVar4 = std::operator<<(poVar4," due to degrees in graph pairs ");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,g);
  std::operator<<(poVar4,'\n');
  _Var5._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  if ((_Var5._M_head_impl)->recover_encoding == true) {
    piVar2 = (n_p->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    for (piVar9 = (n_p->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start; piVar9 != piVar2; piVar9 = piVar9 + 1) {
      recover_adjacency_lines(this,g,p->first,*piVar9,t->first);
    }
    piVar2 = (n_t->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    for (piVar9 = (n_t->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start; piVar9 != piVar2; piVar9 = piVar9 + 1) {
      recover_injectivity_constraint(this,*piVar9);
    }
    _Var5._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  }
  local_38 = n_t;
  std::operator<<((ostream *)
                  ((_Var5._M_head_impl)->proof_stream)._M_t.
                  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                  ,"p");
  piVar2 = (n_p->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  lVar10 = (long)g;
  bVar8 = true;
  for (piVar9 = (n_p->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                ._M_start; piVar9 != piVar2; piVar9 = piVar9 + 1) {
    local_58.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>
    .super__Tuple_impl<2UL,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
         (long)*piVar9;
    local_58.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>
    .super__Tuple_impl<2UL,_long,_long>.super__Tuple_impl<3UL,_long>.
    super__Head_base<3UL,_long,_false>._M_head_impl = (_Head_base<3UL,_long,_false>)(long)t->first;
    local_58.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>
    .super__Head_base<1UL,_long,_false>._M_head_impl = (long)p->first;
    local_58.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Head_base<0UL,_long,_false>.
    _M_head_impl = lVar10;
    sVar6 = std::
            map<std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::count(&((this->_imp)._M_t.
                      super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                      .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                     adjacency_lines,&local_58);
    if (sVar6 != 0) {
      poVar4 = std::operator<<((ostream *)
                               (((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                _M_head_impl)->proof_stream)._M_t," ");
      this_00 = &((this->_imp)._M_t.
                  super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                  .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                 adjacency_lines;
      if (bVar8) {
        local_58.super__Tuple_impl<0UL,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_long,_long,_long>.super__Tuple_impl<2UL,_long,_long>.
        super__Head_base<2UL,_long,_false>._M_head_impl = (long)*piVar9;
        local_58.super__Tuple_impl<0UL,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_long,_long,_long>.super__Tuple_impl<2UL,_long,_long>.
        super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl =
             (_Head_base<3UL,_long,_false>)(long)t->first;
        local_58.super__Tuple_impl<0UL,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_long,_long,_long>.super__Head_base<1UL,_long,_false>._M_head_impl =
             (long)p->first;
        local_58.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Head_base<0UL,_long,_false>.
        _M_head_impl = lVar10;
        std::
        map<std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator[](this_00,&local_58);
        std::ostream::_M_insert<long>((long)poVar4);
      }
      else {
        local_58.super__Tuple_impl<0UL,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_long,_long,_long>.super__Tuple_impl<2UL,_long,_long>.
        super__Head_base<2UL,_long,_false>._M_head_impl = (long)*piVar9;
        local_58.super__Tuple_impl<0UL,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_long,_long,_long>.super__Tuple_impl<2UL,_long,_long>.
        super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl =
             (_Head_base<3UL,_long,_false>)(long)t->first;
        local_58.super__Tuple_impl<0UL,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_long,_long,_long>.super__Head_base<1UL,_long,_false>._M_head_impl =
             (long)p->first;
        local_58.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Head_base<0UL,_long,_false>.
        _M_head_impl = lVar10;
        std::
        map<std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator[](this_00,&local_58);
        poVar4 = std::ostream::_M_insert<long>((long)poVar4);
        std::operator<<(poVar4," +");
      }
      bVar8 = false;
    }
  }
  piVar2 = (local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  for (piVar9 = (local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar3._M_t.
      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl = (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                     proof_stream)._M_t, piVar9 != piVar2; piVar9 = piVar9 + 1) {
    poVar4 = std::operator<<((ostream *)
                             uVar3._M_t.
                             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                             ._M_head_impl," ");
    local_58.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>
    .super__Tuple_impl<2UL,_long,_long>.super__Tuple_impl<3UL,_long>.
    super__Head_base<3UL,_long,_false>._M_head_impl = (_Head_base<3UL,_long,_false>)(long)*piVar9;
    std::
    map<long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator[](&((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  injectivity_constraints,(key_type_conflict *)&local_58);
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::operator<<(poVar4," +");
  }
  std::operator<<((ostream *)
                  uVar3._M_t.
                  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                  ._M_head_impl," s 0\n");
  _Var5._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  plVar1 = &(_Var5._M_head_impl)->proof_line;
  *plVar1 = *plVar1 + 1;
  poVar4 = std::operator<<((ostream *)((_Var5._M_head_impl)->proof_stream)._M_t,"ia 1 ~x");
  local_58.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long>.super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>
  ._M_head_impl = (_Head_base<3UL,_long,_false>)(long)p->first;
  local_58.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)t->first;
  pmVar7 = std::
           map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&((this->_imp)._M_t.
                          super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                          .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         variable_mappings,(key_type *)&local_58);
  poVar4 = std::operator<<(poVar4,(string *)pmVar7);
  poVar4 = std::operator<<(poVar4," >= 1 ; ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::operator<<(poVar4,'\n');
  _Var5._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  (_Var5._M_head_impl)->proof_line = (_Var5._M_head_impl)->proof_line + 1;
  local_58.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long>.super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>
  ._M_head_impl._4_4_ = t->first;
  local_58.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long>.super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>
  ._M_head_impl._0_4_ = p->first;
  std::
  _Rb_tree<std::pair<long,long>,std::pair<std::pair<long,long>const,long>,std::_Select1st<std::pair<std::pair<long,long>const,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<std::pair<long,long>const,long>>>
  ::_M_emplace_unique<std::pair<int,int>,long&>
            ((_Rb_tree<std::pair<long,long>,std::pair<std::pair<long,long>const,long>,std::_Select1st<std::pair<std::pair<long,long>const,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<std::pair<long,long>const,long>>>
              *)&(_Var5._M_head_impl)->eliminations,(pair<int,_int> *)&local_58,
             &(_Var5._M_head_impl)->proof_line);
  poVar4 = std::operator<<((ostream *)
                           (((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->proof_stream)._M_t,"d ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::operator<<(poVar4," 0\n");
  return;
}

Assistant:

auto Proof::incompatible_by_degrees(
    int g,
    const NamedVertex & p,
    const vector<int> & n_p,
    const NamedVertex & t,
    const vector<int> & n_t) -> void
{
    *_imp->proof_stream << "* cannot map " << p.second << " to " << t.second << " due to degrees in graph pairs " << g << '\n';

    if (_imp->recover_encoding) {
        for (auto & n : n_p)
            recover_adjacency_lines(g, p.first, n, t.first);
        for (auto & n : n_t)
            recover_injectivity_constraint(n);
    }

    *_imp->proof_stream << "p";
    bool first = true;
    for (auto & n : n_p) {
        // due to loops or labels, it might not be possible to map n to t.first
        if (_imp->adjacency_lines.count(tuple{g, p.first, n, t.first})) {
            if (first) {
                first = false;
                *_imp->proof_stream << " " << get<1>(_imp->adjacency_lines[tuple{g, p.first, n, t.first}]);
            }
            else
                *_imp->proof_stream << " " << get<1>(_imp->adjacency_lines[tuple{g, p.first, n, t.first}]) << " +";
        }
    }

    // if I map p to t, I have to map the neighbours of p to neighbours of t
    for (auto & n : n_t)
        *_imp->proof_stream << " " << get<1>(_imp->injectivity_constraints[n]) << " +";

    *_imp->proof_stream << " s 0\n";
    ++_imp->proof_line;

    *_imp->proof_stream << "ia 1 ~x" << _imp->variable_mappings[pair{p.first, t.first}] << " >= 1 ; " << _imp->proof_line << '\n';
    ++_imp->proof_line;
    _imp->eliminations.emplace(pair{p.first, t.first}, _imp->proof_line);

    *_imp->proof_stream << "d " << _imp->proof_line - 1 << " 0\n";
}